

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O0

void Wlc_WinCompute_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vLeaves,Vec_Int_t *vNodes)

{
  int iVar1;
  Wlc_Obj_t *pObj_00;
  undefined4 local_34;
  int i;
  Wlc_Obj_t *pFanin;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vLeaves_local;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  
  if ((*(ushort *)pObj >> 7 & 1) == 0) {
    *(ushort *)pObj = *(ushort *)pObj & 0xff7f | 0x80;
    iVar1 = Wlc_ObjIsArithm(pObj);
    if (iVar1 == 0) {
      iVar1 = Wlc_ObjId(p,pObj);
      Vec_IntPush(vLeaves,iVar1);
    }
    else {
      for (local_34 = 0; iVar1 = Wlc_ObjFaninNum(pObj), local_34 < iVar1; local_34 = local_34 + 1) {
        iVar1 = Wlc_ObjFaninId(pObj,local_34);
        pObj_00 = Wlc_NtkObj(p,iVar1);
        Wlc_WinCompute_rec(p,pObj_00,vLeaves,vNodes);
      }
      iVar1 = Wlc_ObjId(p,pObj);
      Vec_IntPush(vNodes,iVar1);
    }
  }
  return;
}

Assistant:

void Wlc_WinCompute_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vLeaves, Vec_Int_t * vNodes )
{
    Wlc_Obj_t * pFanin;  int i;
    if ( pObj->Mark )
        return;
    pObj->Mark = 1;
    if ( !Wlc_ObjIsArithm(pObj) )
    {
        Vec_IntPush( vLeaves, Wlc_ObjId(p, pObj) );
        return;
    }
    Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
        Wlc_WinCompute_rec( p, pFanin, vLeaves, vNodes );
    Vec_IntPush( vNodes, Wlc_ObjId(p, pObj) );
}